

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

OperatorResultType
duckdb::RangeDateTimeFunction<false>
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  long lVar1;
  data_ptr_t pdVar2;
  AddOperator *this;
  bool bVar3;
  RangeDateTimeLocalState *this_00;
  reference pvVar4;
  long lVar5;
  timestamp_t tVar6;
  BinderException *pBVar7;
  DataChunk *pDVar8;
  ulong uVar9;
  idx_t c;
  ulong uVar10;
  interval_t right;
  allocator local_59;
  string local_58;
  timestamp_t *local_38;
  
  pDVar8 = output;
  this_00 = (RangeDateTimeLocalState *)
            optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->(&data_p->local_state);
  local_38 = &this_00->start;
  if ((this_00->initialized_row & 1U) != 0) goto LAB_018ac1f3;
  do {
    uVar9 = this_00->current_input_row;
    if (input->count <= uVar9) {
      this_00->current_input_row = 0;
      this_00->initialized_row = false;
      return NEED_MORE_INPUT;
    }
    DataChunk::Flatten(input);
    uVar10 = 0;
    do {
      if ((ulong)(((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                         .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x68) <= uVar10) {
        pvVar4 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
        (this_00->start).value = *(int64_t *)(pvVar4->data + uVar9 * 8);
        pvVar4 = vector<duckdb::Vector,_true>::get<true>(&input->data,1);
        (this_00->end).value = *(int64_t *)(pvVar4->data + uVar9 * 8);
        pvVar4 = vector<duckdb::Vector,_true>::get<true>(&input->data,2);
        uVar10 = *(ulong *)(pvVar4->data + uVar9 * 0x10);
        pDVar8 = *(DataChunk **)(pvVar4->data + uVar9 * 0x10 + 8);
        (this_00->increment).months = (int)uVar10;
        (this_00->increment).days = (int)(uVar10 >> 0x20);
        (this_00->increment).micros = (int64_t)pDVar8;
        lVar5 = (this_00->start).value;
        if ((((lVar5 == -0x7fffffffffffffff) || (lVar5 == 0x7fffffffffffffff)) ||
            (lVar1 = (this_00->end).value, lVar1 == 0x7fffffffffffffff)) ||
           (lVar1 == -0x7fffffffffffffff)) {
          pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_58,"RANGE with infinite bounds is not supported",&local_59);
          BinderException::BinderException(pBVar7,&local_58);
          __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((pDVar8 == (DataChunk *)0x0 && (int)uVar10 == 0) && uVar10 >> 0x20 == 0) {
          pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string((string *)&local_58,"interval cannot be 0!",&local_59);
          BinderException::BinderException(pBVar7,&local_58);
          __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (((long)pDVar8 < 1 && (int)uVar10 < 1) && (int)(uVar10 >> 0x20) < 1) {
          this_00->greater_than_check = false;
          if (lVar1 <= lVar5) goto LAB_018ac1e5;
        }
        else {
          if (((uVar10 & 0x8000000080000000) != 0) || ((long)pDVar8 < 0)) {
            pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_58,
                       "RANGE with composite interval that has mixed signs is not supported",
                       &local_59);
            BinderException::BinderException(pBVar7,&local_58);
            __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          this_00->greater_than_check = true;
          if (lVar5 <= lVar1) goto LAB_018ac1e5;
        }
        this_00->empty_range = true;
        goto LAB_018ac1e5;
      }
      pvVar4 = vector<duckdb::Vector,_true>::get<true>(&input->data,uVar10);
      bVar3 = FlatVector::IsNull(pvVar4,uVar9);
      uVar10 = uVar10 + 1;
    } while (!bVar3);
    *(int32_t *)&local_38[2].value = 0;
    *(int32_t *)((long)&local_38[2].value + 4) = 0;
    local_38[3] = 0;
    local_38->value = 0;
    local_38[1].value = 0;
    this_00->greater_than_check = true;
    lVar5 = 0;
LAB_018ac1e5:
    this_00->inclusive_bound = false;
    this_00->initialized_row = true;
    (this_00->current_state).value = lVar5;
LAB_018ac1f3:
    if (this_00->empty_range == true) {
      output->count = 0;
      this_00->current_input_row = this_00->current_input_row + 1;
      this_00->initialized_row = false;
      return HAVE_MORE_OUTPUT;
    }
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&output->data,0);
    pdVar2 = pvVar4->data;
    tVar6.value = (this_00->current_state).value;
    for (uVar9 = 0;
        (bVar3 = RangeDateTimeLocalState::Finished(this_00,tVar6), !bVar3 && (uVar9 < 0x800));
        uVar9 = uVar9 + 1) {
      this = (AddOperator *)(this_00->current_state).value;
      *(AddOperator **)(pdVar2 + uVar9 * 8) = this;
      tVar6.value._0_4_ = (this_00->increment).months;
      tVar6.value._4_4_ = (this_00->increment).days;
      right.micros = (int64_t)pDVar8;
      right._0_8_ = (this_00->increment).micros;
      tVar6 = AddOperator::Operation<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
                        (this,tVar6,right);
      (this_00->current_state).value = tVar6.value;
    }
    if (uVar9 != 0) {
      output->count = uVar9;
      return HAVE_MORE_OUTPUT;
    }
    this_00->current_input_row = this_00->current_input_row + 1;
    this_00->initialized_row = false;
  } while( true );
}

Assistant:

static OperatorResultType RangeDateTimeFunction(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
                                                DataChunk &output) {
	auto &state = data_p.local_state->Cast<RangeDateTimeLocalState>();
	while (true) {
		if (!state.initialized_row) {
			// initialize for the current input row
			if (state.current_input_row >= input.size()) {
				// ran out of rows
				state.current_input_row = 0;
				state.initialized_row = false;
				return OperatorResultType::NEED_MORE_INPUT;
			}
			GenerateRangeDateTimeParameters<GENERATE_SERIES>(input, state.current_input_row, state);
			state.initialized_row = true;
			state.current_state = state.start;
		}
		if (state.empty_range) {
			// empty range
			output.SetCardinality(0);
			state.current_input_row++;
			state.initialized_row = false;
			return OperatorResultType::HAVE_MORE_OUTPUT;
		}
		idx_t size = 0;
		auto data = FlatVector::GetData<timestamp_t>(output.data[0]);
		while (true) {
			if (state.Finished(state.current_state)) {
				break;
			}
			if (size >= STANDARD_VECTOR_SIZE) {
				break;
			}
			data[size++] = state.current_state;
			state.current_state =
			    AddOperator::Operation<timestamp_t, interval_t, timestamp_t>(state.current_state, state.increment);
		}
		if (size == 0) {
			// move to next row
			state.current_input_row++;
			state.initialized_row = false;
			continue;
		}
		output.SetCardinality(size);
		return OperatorResultType::HAVE_MORE_OUTPUT;
	}
}